

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diag.cpp
# Opt level: O0

int __thiscall ncnn::Diag::forward(Diag *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  Allocator *in_RDX;
  long *in_RSI;
  Mat *in_RDI;
  bool bVar2;
  int i_2;
  int bias_c_1;
  int bias_r_1;
  int maximum;
  int minimum;
  int len;
  int h;
  int w_1;
  int i_1;
  int bias_c;
  int bias_r;
  int top_w;
  int w;
  size_t elemsize;
  int dims;
  int i;
  float *ptr;
  int size;
  Allocator *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  int iVar3;
  int in_stack_fffffffffffffedc;
  int local_114;
  int local_110 [2];
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  long local_c0;
  int local_b4;
  Allocator *local_a8;
  long *local_a0;
  Allocator *local_88;
  Allocator *local_80;
  int local_74;
  _func_int **local_70;
  int local_68;
  undefined4 local_64;
  Allocator *local_60;
  long local_58;
  int local_44;
  Allocator *local_18;
  Allocator *local_10;
  Allocator *local_8;
  
  local_b4 = (int)in_RSI[5];
  local_c0 = in_RSI[2];
  local_a8 = in_RDX;
  local_a0 = in_RSI;
  if (local_b4 == 1) {
    in_stack_fffffffffffffedc = *(int *)((long)in_RSI + 0x2c);
    if ((int)in_RDI[2].cstep < 0) {
      iVar3 = -(int)in_RDI[2].cstep;
    }
    else {
      iVar3 = (int)in_RDI[2].cstep;
    }
    local_c8 = in_stack_fffffffffffffedc + iVar3;
    local_c4 = in_stack_fffffffffffffedc;
    Mat::create(in_RDI,in_stack_fffffffffffffedc,iVar3,
                CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                in_stack_fffffffffffffec8);
    local_80 = local_a8;
    in_stack_fffffffffffffed7 = true;
    if (local_a8->_vptr_Allocator != (_func_int **)0x0) {
      local_10 = local_a8;
      in_stack_fffffffffffffed7 =
           (long)local_a8[8]._vptr_Allocator * (long)*(int *)&local_a8[7]._vptr_Allocator == 0;
    }
    if ((bool)in_stack_fffffffffffffed7 != false) {
      return -100;
    }
    local_60 = local_a8;
    local_64 = 0;
    local_18 = local_a8;
    local_68 = (int)local_a8[8]._vptr_Allocator * *(int *)&local_a8[7]._vptr_Allocator;
    local_70 = local_a8->_vptr_Allocator;
    for (local_74 = 0; local_74 < local_68; local_74 = local_74 + 1) {
      *(undefined4 *)local_70 = 0;
      local_70 = (_func_int **)((long)local_70 + 4);
    }
    local_d0 = 0;
    in_stack_fffffffffffffec8 = local_a8;
    piVar1 = std::min<int>((int *)&in_RDI[2].cstep,&local_d0);
    local_cc = -*piVar1;
    local_d8 = 0;
    piVar1 = std::max<int>((int *)&in_RDI[2].cstep,&local_d8);
    local_d4 = *piVar1;
    for (local_dc = 0; local_dc < local_c4; local_dc = local_dc + 1) {
      local_58 = (long)local_dc;
      local_44 = local_dc + local_cc;
      *(undefined4 *)
       ((long)local_a8->_vptr_Allocator +
       (long)(local_dc + local_d4) * 4 +
       (long)*(int *)((long)&local_a8[5]._vptr_Allocator + 4) * (long)local_44 *
       (long)local_a8[2]._vptr_Allocator) = *(undefined4 *)(*local_a0 + local_58 * 4);
    }
  }
  if (local_b4 == 2) {
    local_e0 = *(int *)((long)local_a0 + 0x2c);
    local_e4 = (int)local_a0[6];
    local_e8 = 0;
    local_f0 = local_e0 - local_e4;
    local_f4 = 0;
    piVar1 = std::min<int>(&local_f0,&local_f4);
    local_ec = *piVar1;
    local_fc = local_e0 - local_e4;
    local_100 = 0;
    piVar1 = std::max<int>(&local_fc,&local_100);
    local_f8 = *piVar1;
    if ((local_f8 < (int)in_RDI[2].cstep) || ((int)in_RDI[2].cstep < local_ec)) {
      if ((-local_e4 < (int)in_RDI[2].cstep) && ((int)in_RDI[2].cstep < local_ec)) {
        local_e8 = (int)in_RDI[2].cstep + local_e4;
      }
      else if ((local_f8 < (int)in_RDI[2].cstep) && ((int)in_RDI[2].cstep < local_e0)) {
        local_e8 = local_e0 - (int)in_RDI[2].cstep;
      }
    }
    else {
      piVar1 = std::min<int>(&local_e0,&local_e4);
      local_e8 = *piVar1;
    }
    Mat::create(in_RDI,in_stack_fffffffffffffedc,
                CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                in_stack_fffffffffffffec8);
    local_88 = local_a8;
    bVar2 = true;
    if (local_a8->_vptr_Allocator != (_func_int **)0x0) {
      local_8 = local_a8;
      bVar2 = (long)local_a8[8]._vptr_Allocator * (long)*(int *)&local_a8[7]._vptr_Allocator == 0;
    }
    if (bVar2) {
      if (local_e8 == 0) {
        return 0;
      }
      return -100;
    }
    local_108 = 0;
    piVar1 = std::min<int>((int *)&in_RDI[2].cstep,&local_108);
    local_104 = -*piVar1;
    local_110[0] = 0;
    piVar1 = std::max<int>((int *)&in_RDI[2].cstep,local_110);
    iVar3 = *piVar1;
    for (local_114 = 0; local_114 < local_e8; local_114 = local_114 + 1) {
      *(undefined4 *)((long)local_a8->_vptr_Allocator + (long)local_114 * 4) =
           *(undefined4 *)
            (*local_a0 +
             (long)*(int *)((long)local_a0 + 0x2c) * (long)(local_114 + local_104) * local_a0[2] +
            (long)(local_114 + iVar3) * 4);
    }
  }
  return 0;
}

Assistant:

int Diag::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (dims == 1)
    {
        int w = bottom_blob.w;
        int top_w = w + ((diagonal >= 0) ? diagonal : -diagonal);

        top_blob.create(top_w, top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.fill(0.0f);

        int bias_r = -std::min(diagonal, 0);
        int bias_c = std::max(diagonal, 0);

        for (int i = 0; i < w; i++)
        {
            top_blob.row(i + bias_r)[i + bias_c] = bottom_blob[i];
        }
    }
    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int len = 0;
        int minimum = std::min(w - h, 0);
        int maximum = std::max(w - h, 0);
        if (diagonal <= maximum && diagonal >= minimum)
            len = std::min(w, h);
        else if (diagonal > -h && diagonal < minimum)
            len = diagonal + h;
        else if (diagonal > maximum && diagonal < w)
            len = -diagonal + w;

        top_blob.create(len, elemsize, opt.blob_allocator);
        if (top_blob.empty())
        {
            if (len == 0)
                return 0;
            return -100;
        }

        int bias_r = -std::min(diagonal, 0);
        int bias_c = std::max(diagonal, 0);

        for (int i = 0; i < len; i++)
        {
            top_blob[i] = bottom_blob.row(i + bias_r)[i + bias_c];
        }
    }

    return 0;
}